

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall QString::operator=(QString *this,QLatin1StringView other)

{
  __atomic_base<int> _Var1;
  Data *pDVar2;
  char16_t *pcVar3;
  QArrayData *data;
  qsizetype qVar4;
  QString *this_00;
  ulong uVar5;
  storage_type *psVar6;
  QString *size;
  char *__s;
  long in_FS_OFFSET;
  bool bVar7;
  QByteArrayView ba;
  QString local_38;
  long local_20;
  
  size = (QString *)other.m_size;
  __s = other.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if (pDVar2 == (Data *)0x0) {
    uVar5 = 0;
  }
  else {
    _Var1._M_i = (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    uVar5 = (ulong)(uint)_Var1._M_i;
    if ((_Var1._M_i == 1) &&
       ((long)size <=
        (pDVar2->super_QArrayData).alloc -
        ((long)((long)(this->d).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)))
    {
      (this->d).size = (qsizetype)size;
      pcVar3 = (this->d).ptr;
      pcVar3[(long)size] = L'\0';
      qt_from_latin1(pcVar3,__s,(size_t)size);
      goto LAB_0015cc63;
    }
  }
  this_00 = (QString *)0x0;
  if (0 < (long)size) {
    this_00 = size;
  }
  bVar7 = __s == (char *)0x0;
  if (bVar7) {
    this_00 = (QString *)0x0;
  }
  psVar6 = (storage_type *)CONCAT71((int7)(uVar5 >> 8),bVar7 || -1 < (long)size);
  if (!bVar7 && -1 >= (long)size) {
    this_00 = (QString *)strlen(__s);
  }
  ba.m_data = psVar6;
  ba.m_size = (qsizetype)__s;
  fromLatin1(&local_38,this_00,ba);
  data = &((this->d).d)->super_QArrayData;
  pcVar3 = (this->d).ptr;
  (this->d).d = local_38.d.d;
  (this->d).ptr = local_38.d.ptr;
  qVar4 = (this->d).size;
  (this->d).size = local_38.d.size;
  local_38.d.d = (Data *)data;
  local_38.d.ptr = pcVar3;
  local_38.d.size = qVar4;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
LAB_0015cc63:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QString &QString::operator=(QLatin1StringView other)
{
    const qsizetype capacityAtEnd = capacity() - d.freeSpaceAtBegin();
    if (isDetached() && other.size() <= capacityAtEnd) { // assumes d->alloc == 0 -> !isDetached() (sharedNull)
        d.size = other.size();
        d.data()[other.size()] = 0;
        qt_from_latin1(d.data(), other.latin1(), other.size());
    } else {
        *this = fromLatin1(other.latin1(), other.size());
    }
    return *this;
}